

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lights.cpp
# Opt level: O1

SP __thiscall pbrt::SemanticParser::createLightSource_point(SemanticParser *this,SP *in)

{
  float fVar1;
  undefined8 uVar2;
  long lVar3;
  bool bVar4;
  int iVar5;
  runtime_error *this_00;
  long *plVar6;
  long *plVar7;
  long *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var8;
  SP *result;
  _Rb_tree_node_base *p_Var9;
  float fVar10;
  float fVar11;
  undefined1 auVar12 [16];
  SP SVar13;
  SP light;
  size_t N;
  string name;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
  it;
  element_type *local_138;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_130;
  float local_128;
  float local_124;
  long *local_120;
  long local_118;
  long local_110;
  long lStack_108;
  SemanticParser *local_100;
  string local_f8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
  local_d8;
  float local_a8;
  float fStack_a4;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_138 = (element_type *)0x0;
  local_100 = this;
  p_Stack_130 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x80);
  p_Stack_130->_M_use_count = 1;
  p_Stack_130->_M_weak_count = 1;
  p_Stack_130->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00168bc0;
  local_138 = (element_type *)(p_Stack_130 + 1);
  p_Stack_130[1]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Stack_130[1]._M_use_count = 0;
  p_Stack_130[1]._M_weak_count = 0;
  p_Stack_130[3]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Stack_130[3]._M_use_count = 0;
  p_Stack_130[3]._M_weak_count = 0;
  p_Stack_130[4]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Stack_130[4]._M_use_count = 0;
  p_Stack_130[4]._M_weak_count = 0;
  p_Stack_130[5]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Stack_130[5]._M_use_count = 0;
  p_Stack_130[5]._M_weak_count = 0;
  p_Stack_130[6]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Stack_130[6]._M_use_count = 0;
  p_Stack_130[6]._M_weak_count = 0;
  p_Stack_130[7]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Stack_130[7]._M_use_count = 0;
  p_Stack_130[7]._M_weak_count = 0;
  p_Stack_130[2]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Stack_130[2]._M_use_count = 0;
  p_Stack_130[2]._M_weak_count = 0;
  p_Stack_130[1]._vptr__Sp_counted_base = (_func_int **)&PTR_toString_abi_cxx11__00167c90;
  *(undefined8 *)((long)&p_Stack_130[3]._vptr__Sp_counted_base + 4) = 0x3f8000003f800000;
  p_Stack_130[3]._M_weak_count = 0x3f800000;
  p_Stack_130[4]._M_use_count = 0;
  p_Stack_130[4]._M_weak_count = 0;
  p_Stack_130[5]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Stack_130[4]._vptr__Sp_counted_base = (_func_int **)&PTR_toString_abi_cxx11__00167490;
  p_Stack_130[5]._M_use_count = 0;
  p_Stack_130[5]._M_weak_count = 0;
  p_Stack_130[6]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Stack_130[6]._M_use_count = 0;
  p_Stack_130[6]._M_weak_count = 0;
  p_Stack_130[7]._vptr__Sp_counted_base = (_func_int **)0x3f8000003f800000;
  p_Stack_130[7]._M_use_count = 0x3f800000;
  std::__shared_ptr<pbrt::PointLightSource,(__gnu_cxx::_Lock_policy)2>::
  _M_enable_shared_from_this_with<pbrt::PointLightSource,pbrt::PointLightSource>
            ((__shared_ptr<pbrt::PointLightSource,(__gnu_cxx::_Lock_policy)2> *)&local_138,
             (PointLightSource *)local_138);
  lVar3 = *in_RDX;
  p_Var9 = *(_Rb_tree_node_base **)(lVar3 + 0x20);
  _Var8._M_pi = extraout_RDX;
  if (p_Var9 != (_Rb_tree_node_base *)(lVar3 + 0x10)) {
    local_124 = *(float *)(lVar3 + 0x60);
    local_68 = *(undefined8 *)(lVar3 + 0x58);
    uStack_60 = 0;
    local_78 = *(undefined8 *)(lVar3 + 100);
    uStack_70 = 0;
    local_88 = *(undefined8 *)(lVar3 + 0x70);
    uStack_80 = 0;
    local_98 = *(undefined8 *)(lVar3 + 0x7c);
    uStack_90 = 0;
    local_128 = *(float *)(lVar3 + 0x84);
    local_a8 = *(float *)(lVar3 + 0x6c);
    fStack_a4 = *(float *)(lVar3 + 0x78);
    uStack_a0 = 0;
    do {
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
      ::pair(&local_d8,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
              *)(p_Var9 + 1));
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_f8,local_d8.first._M_dataplus._M_p,
                 local_d8.first._M_dataplus._M_p + local_d8.first._M_string_length);
      iVar5 = std::__cxx11::string::compare((char *)&local_f8);
      if (iVar5 == 0) {
        syntactic::ParamSet::getParam3f
                  ((ParamSet *)(*in_RDX + 8),(float *)&local_138->cameras,&local_f8);
        fVar1 = *(float *)&(local_138->cameras).
                           super__Vector_base<std::shared_ptr<pbrt::Camera>,_std::allocator<std::shared_ptr<pbrt::Camera>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
        uVar2 = *(undefined8 *)
                 ((long)&(local_138->cameras).
                         super__Vector_base<std::shared_ptr<pbrt::Camera>,_std::allocator<std::shared_ptr<pbrt::Camera>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + 4);
        fVar10 = (float)uVar2;
        fVar11 = (float)((ulong)uVar2 >> 0x20);
        (local_138->cameras).
        super__Vector_base<std::shared_ptr<pbrt::Camera>,_std::allocator<std::shared_ptr<pbrt::Camera>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)CONCAT44(fVar11 * local_88._4_4_ +
                               fVar10 * local_78._4_4_ + fVar1 * local_68._4_4_ + local_98._4_4_,
                               fVar11 * (float)local_88 +
                               fVar10 * (float)local_78 + fVar1 * (float)local_68 + (float)local_98)
        ;
        *(float *)&(local_138->cameras).
                   super__Vector_base<std::shared_ptr<pbrt::Camera>,_std::allocator<std::shared_ptr<pbrt::Camera>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish =
             fStack_a4 * fVar11 + local_124 * fVar1 + local_a8 * fVar10 + local_128;
      }
      else {
        iVar5 = std::__cxx11::string::compare((char *)&local_f8);
        if (iVar5 == 0) {
          result = &local_138->pixelFilter;
        }
        else {
          iVar5 = std::__cxx11::string::compare((char *)&local_f8);
          if (iVar5 != 0) {
            this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::operator+(&local_50,"unknown \'point\' light source param \'",&local_f8);
            plVar6 = (long *)std::__cxx11::string::append((char *)&local_50);
            local_120 = (long *)*plVar6;
            plVar7 = plVar6 + 2;
            if (local_120 == plVar7) {
              local_110 = *plVar7;
              lStack_108 = plVar6[3];
              local_120 = &local_110;
            }
            else {
              local_110 = *plVar7;
            }
            local_118 = plVar6[1];
            *plVar6 = (long)plVar7;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            std::runtime_error::runtime_error(this_00,(string *)&local_120);
            __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          bVar4 = syntactic::ParamSet::hasParam3f((ParamSet *)(*in_RDX + 8),&local_f8);
          if (!bVar4) {
            local_120 = (long *)0x0;
            syntactic::ParamSet::getParamPairNf
                      ((ParamSet *)(*in_RDX + 8),(value_type *)0x0,(size_t *)&local_120,&local_f8);
            std::vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>::resize
                      ((vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_> *
                       )&(local_138->sampler).
                         super___shared_ptr<pbrt::Sampler,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                       (size_type)local_120);
            syntactic::ParamSet::getParamPairNf
                      ((ParamSet *)(*in_RDX + 8),
                       (value_type *)
                       (local_138->sampler).
                       super___shared_ptr<pbrt::Sampler,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                       _M_pi,(size_t *)&local_120,&local_f8);
            goto LAB_001464c5;
          }
          result = (SP *)((long)&(local_138->cameras).
                                 super__Vector_base<std::shared_ptr<pbrt::Camera>,_std::allocator<std::shared_ptr<pbrt::Camera>_>_>
                                 ._M_impl.super__Vector_impl_data + 0xc);
        }
        syntactic::ParamSet::getParam3f((ParamSet *)(*in_RDX + 8),(float *)result,&local_f8);
      }
LAB_001464c5:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
      }
      if (local_d8.second.super___shared_ptr<pbrt::syntactic::Param,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_d8.second.
                   super___shared_ptr<pbrt::syntactic::Param,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8.first._M_dataplus._M_p != &local_d8.first.field_2) {
        operator_delete(local_d8.first._M_dataplus._M_p,
                        local_d8.first.field_2._M_allocated_capacity + 1);
      }
      auVar12 = std::_Rb_tree_increment(p_Var9);
      _Var8._M_pi = auVar12._8_8_;
      p_Var9 = auVar12._0_8_;
    } while (p_Var9 != (_Rb_tree_node_base *)(lVar3 + 0x10));
  }
  (local_100->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (local_100->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_138
  ;
  (local_100->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = p_Stack_130;
  SVar13.super___shared_ptr<pbrt::LightSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var8._M_pi;
  SVar13.super___shared_ptr<pbrt::LightSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_100;
  return (SP)SVar13.super___shared_ptr<pbrt::LightSource,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

LightSource::SP SemanticParser::createLightSource_point
  (pbrt::syntactic::LightSource::SP in)
  {
    PointLightSource::SP light = std::make_shared<PointLightSource>();
    affine3f transform = in->transform.atStart;
    for (auto it : in->param) {
      const std::string name = it.first;
      if (name == "from") {
        in->getParam3f(&light->from.x,name);
        light->from = xfmPoint(transform,light->from);
        continue;
      }
      if (name == "scale") {
        in->getParam3f(&light->scale.x,name);
        continue;
      }
      if (name == "I") {
        if (in->hasParam3f(name)) 
          in->getParam3f(&light->I.x,name);
        else {
          std::size_t N=0;
          in->getParamPairNf(nullptr,&N,name);
          light->Ispectrum.spd.resize(N);
          in->getParamPairNf(light->Ispectrum.spd.data(),&N,name);
        }
        continue;
      }
      throw std::runtime_error("unknown 'point' light source param '"+name+"'");
    }
    
    return light;
  }